

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

seed_t lest::seed(text *opt,text *arg)

{
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  char *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  string local_88 [128];
  seed_t local_8;
  
  bVar1 = std::operator==(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  if (bVar1) {
    local_8 = time((time_t *)0x0);
  }
  else {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),in_RSI);
    bVar1 = is_number((text *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    std::__cxx11::string::~string(in_stack_fffffffffffffed0);
    if (!bVar1) {
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x10);
      std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      std::operator+(in_stack_fffffffffffffed8,(char *)__rhs);
      std::operator+(in_stack_fffffffffffffed8,__rhs);
      std::operator+(in_stack_fffffffffffffed8,(char *)__rhs);
      std::runtime_error::runtime_error((runtime_error *)__rhs,local_88);
      __cxa_throw(__rhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),in_RSI);
    iVar2 = stoi((text *)0x10acf8);
    local_8 = (seed_t)iVar2;
    std::__cxx11::string::~string(in_stack_fffffffffffffed0);
  }
  return local_8;
}

Assistant:

inline seed_t seed( text opt, text arg )
{
    // std::time_t: implementation dependent

    if ( arg == "time" )
        return static_cast<seed_t>( time( lest_nullptr ) );

    if ( is_number( arg ) )
        return static_cast<seed_t>( lest::stoi( arg ) );

    throw std::runtime_error( "expecting 'time' or positive number with option '" + opt + "', got '" + arg + "' (try option --help)" );
}